

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::LineDataDrawer::DrawData
          (LineDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  Trafo *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  long lStack_88;
  bool theDrawPoint;
  long theLast;
  int theI;
  int theStride;
  long theEnd;
  long theStart;
  float local_60;
  float theTraY;
  float theTraX;
  float fStack_54;
  bool theFirst;
  float thePrevY;
  float thePrevX;
  long theYSize;
  long theXSize;
  PRect *inRect_local;
  AxisSetup *inXAxisSetup_local;
  PlotDataSelection *inPlotDataSelection_local;
  PlotDataBase *inYData_local;
  PlotDataBase *inXData_local;
  LineDataDrawer *this_local;
  
  if (((this->super_DataDrawerBase).mXTrafo == (Trafo *)0x0) ||
     ((this->super_DataDrawerBase).mYTrafo == (Trafo *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    theXSize = (long)inRect;
    inRect_local = (PRect *)inXAxisSetup;
    inXAxisSetup_local = (AxisSetup *)inPlotDataSelection;
    inPlotDataSelection_local = (PlotDataSelection *)inYData;
    inYData_local = inXData;
    inXData_local = (PlotDataBase *)this;
    lVar5 = PlotDataBase::GetSize(inXData);
    if ((lVar5 == 0) ||
       (lVar5 = PlotDataBase::GetSize((PlotDataBase *)inPlotDataSelection_local), lVar5 == 0)) {
      this_local._7_1_ = false;
    }
    else {
      theYSize = PlotDataBase::GetSize(inYData_local);
      _thePrevY = PlotDataBase::GetSize((PlotDataBase *)inPlotDataSelection_local);
      if (_thePrevY < theYSize) {
        this_local._7_1_ = false;
      }
      else {
        (*inPainter->_vptr_Painter[0xc])(inPainter,&this->mStyle);
        fStack_54 = 0.0;
        theTraX = 0.0;
        theTraY._3_1_ = 1;
        theEnd = 0;
        _theI = PlotDataBase::GetSize(inYData_local);
        _theI = _theI + -1;
        theLast._4_4_ = 1;
        if (((this->super_DataDrawerBase).mDrawFast & 1U) != 0) {
          FindRange(inYData_local,*(float *)&inRect_local->mX,
                    *(float *)((long)&inRect_local->mX + 4),&theEnd,(long *)&theI);
          lVar5 = _theI - theEnd;
          iVar3 = (*inPainter->_vptr_Painter[4])();
          theLast._4_4_ = (int)((lVar5 + 1) / CONCAT44(extraout_var,iVar3));
          if (theLast._4_4_ == 0) {
            theLast._4_4_ = 1;
          }
        }
        for (theLast._0_4_ = (int)theEnd; (int)theLast <= _theI;
            theLast._0_4_ = theLast._4_4_ + (int)theLast) {
          pTVar1 = (this->super_DataDrawerBase).mXTrafo;
          PlotDataBase::GetValue(inYData_local,(long)(int)theLast);
          (*pTVar1->_vptr_Trafo[2])();
          local_60 = extraout_XMM0_Da;
          if (theLast._4_4_ < 2) {
            pTVar1 = (this->super_DataDrawerBase).mYTrafo;
            PlotDataBase::GetValue((PlotDataBase *)inPlotDataSelection_local,(long)(int)theLast);
            (*pTVar1->_vptr_Trafo[2])();
            theStart._4_4_ = extraout_XMM0_Da_01;
          }
          else {
            lStack_88 = (long)((int)theLast + theLast._4_4_ + -1);
            if (_theI < lStack_88) {
              lStack_88 = _theI;
            }
            pTVar1 = (this->super_DataDrawerBase).mYTrafo;
            GetMaxFromRange((PlotDataBase *)inPlotDataSelection_local,(long)(int)theLast,lStack_88);
            (*pTVar1->_vptr_Trafo[2])();
            theStart._4_4_ = extraout_XMM0_Da_00;
          }
          if (((theTraY._3_1_ & 1) == 0) && (((this->super_DataDrawerBase).field_0x24 & 1) != 0)) {
            (**inPainter->_vptr_Painter)(fStack_54,theTraX,local_60,theStart._4_4_);
          }
          else {
            theTraY._3_1_ = 0;
          }
          if ((((this->super_DataDrawerBase).field_0x25 & 1) != 0) &&
             (uVar4 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                                (this,(ulong)(uint)(int)local_60,(ulong)(uint)(int)theStart._4_4_,
                                 theXSize,inPainter), (uVar4 & 1) == 0)) {
            return false;
          }
          bVar2 = PlotDataSelection::IsSelected
                            ((PlotDataSelection *)inXAxisSetup_local,(long)(int)theLast);
          if ((bVar2) &&
             (uVar4 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[5])
                                (this,(ulong)(uint)(int)local_60,(ulong)(uint)(int)theStart._4_4_,
                                 theXSize,inPainter), (uVar4 & 1) == 0)) {
            return false;
          }
          fStack_54 = local_60;
          theTraX = theStart._4_4_;
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LineDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if ((inXData.GetSize () == 0) || (inYData.GetSize () == 0)) {
          return false;
      }
      long theXSize = inXData.GetSize ();
      long theYSize = inYData.GetSize ();
      if (theXSize>theYSize) {
        return false;
      }
      inPainter.SetStyle (mStyle);
      float thePrevX = 0;
      float thePrevY = 0;
      bool theFirst = true;
      float theTraX, theTraY;

      long theStart = 0;
      long theEnd = inXData.GetSize () - 1;
      int theStride = 1;
      if (mDrawFast) {
          FindRange (inXData, inXAxisSetup.mMin, inXAxisSetup.mMax, theStart, theEnd);

          theStride = (theEnd - theStart + 1) / inPainter.GetWidth ();
          if (theStride == 0) {
              theStride = 1;
          }
      }


      for (int theI = theStart; theI <= theEnd; theI+=theStride) {

        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        if (theStride > 1) {
          long theLast = theI + theStride - 1;
          if (theLast>theEnd) {
            theLast = theEnd;
          }
            theTraY = mYTrafo->Transform (GetMaxFromRange (inYData, theI, theLast));
        }
        else {
            theTraY = mYTrafo->Transform (inYData.GetValue (theI));
        }

        if (!theFirst && mDrawLine) {
          inPainter.DrawLine (thePrevX, thePrevY, theTraX, theTraY);
        }
        else {
          theFirst = false;
        }
        bool theDrawPoint = mDrawPoint;

        if (theDrawPoint && !DrawPoint (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        if (inPlotDataSelection.IsSelected (theI) && !DrawSelection (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        thePrevX = theTraX;
        thePrevY = theTraY;
      }
      return true;
    }